

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double burr_cdf_inv(double cdf,double a,double b,double c,double d)

{
  double dVar1;
  double y;
  double x;
  double d_local;
  double c_local;
  double b_local;
  double a_local;
  double cdf_local;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = pow(1.0 / (1.0 - cdf),1.0 / d);
    dVar1 = pow(dVar1 - 1.0,1.0 / c);
    return b * dVar1 + a;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"BURR_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double burr_cdf_inv ( double cdf, double a, double b, double c, double d )

//****************************************************************************80
//
//  Purpose:
//
//    BURR_CDF_INV inverts the Burr CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    08 August 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, C, D, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double BURR_CDF_INV, the corresponding argument.
//
{
  double x;
  double y;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "BURR_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  y = pow ( pow ( 1.0 / ( 1.0 - cdf ), 1.0 / d ) - 1.0, 1.0 / c );

  x = a + b * y;

  return x;
}